

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleLocalPolynomial.hpp
# Opt level: O3

double TasGrid::RuleLocal::diffPWPower<(TasGrid::RuleLocal::erule)1>
                 (int max_order,int point,double x)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  size_type sVar7;
  long lVar8;
  long lVar9;
  size_type __n;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  vector<double,_std::allocator<double>_> left_prods;
  allocator_type local_41;
  double local_40;
  vector<double,_std::allocator<double>_> local_38;
  
  if (8 < point) {
    uVar6 = point - 1;
    iVar2 = -1;
    uVar3 = uVar6;
    do {
      uVar3 = (int)uVar3 >> 1;
      iVar2 = iVar2 + 1;
    } while (1 < uVar3);
    iVar5 = max_order + -2;
    if (iVar2 <= max_order + -2) {
      iVar5 = iVar2;
    }
    if (max_order < 1) {
      iVar5 = iVar2;
    }
    __n = (size_type)iVar5;
    local_40 = x;
    ::std::vector<double,_std::allocator<double>_>::vector(&local_38,__n,&local_41);
    *local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = 1.0;
    iVar2 = (int)uVar6 % 2;
    if (iVar2 < 1) {
      dVar10 = 3.0 - ((double)iVar2 + (double)iVar2);
    }
    else {
      dVar10 = (double)(1 - iVar2) + (double)(1 - iVar2) + -3.0;
    }
    dVar11 = -1.0 / dVar10;
    if (iVar5 < 2) {
      dVar15 = local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[__n - 1];
      dVar12 = 1.0;
    }
    else {
      dVar15 = *local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      dVar14 = 3.0;
      sVar7 = 1;
      dVar12 = 1.0;
      iVar2 = 2;
      do {
        dVar15 = (local_40 - dVar10) * dVar15;
        local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[sVar7] = dVar15;
        iVar4 = iVar2 * 2;
        dVar14 = dVar14 + dVar14 + 1.0;
        uVar3 = (int)uVar6 % iVar4;
        if ((int)uVar3 < iVar2) {
          dVar10 = dVar14 - ((double)(int)uVar3 + (double)(int)uVar3);
        }
        else {
          dVar10 = ((double)(int)(~uVar3 + iVar4) + (double)(int)(~uVar3 + iVar4)) - dVar14;
        }
        dVar11 = dVar11 * (-1.0 / dVar10);
        sVar7 = sVar7 + 1;
        iVar2 = iVar4;
      } while (__n != sVar7);
      dVar15 = local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[__n - 1];
      if (1 < iVar5) {
        dVar12 = 1.0;
        lVar8 = (ulong)(iVar5 - 2) + 1;
        dVar13 = dVar10;
        do {
          iVar5 = iVar4 / 2;
          dVar14 = (dVar14 + -1.0) * 0.5;
          uVar3 = (int)uVar6 % iVar5;
          iVar2 = iVar4 + 3;
          if (-1 < iVar4) {
            iVar2 = iVar4;
          }
          if ((int)uVar3 < iVar2 >> 2) {
            dVar10 = dVar14 - ((double)(int)uVar3 + (double)(int)uVar3);
          }
          else {
            dVar10 = ((double)(int)(~uVar3 + iVar5) + (double)(int)(~uVar3 + iVar5)) - dVar14;
          }
          dVar12 = dVar12 * (local_40 - dVar13);
          dVar15 = dVar15 + local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar8 + -1] * dVar12;
          lVar9 = lVar8 + -1;
          bVar1 = 0 < lVar8;
          lVar8 = lVar9;
          dVar13 = dVar10;
          iVar4 = iVar5;
        } while (lVar9 != 0 && bVar1);
      }
    }
    local_40 = ((local_40 - dVar10) * dVar12 * -2.0 * local_40 +
               (local_40 + 1.0) * (1.0 - local_40) * dVar15) * dVar11;
    operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    return local_40;
  }
  dVar10 = diffPWCubic<(TasGrid::RuleLocal::erule)1>(point,x);
  return dVar10;
}

Assistant:

double diffPWPower(int max_order, int point, double x) {
        // use the cubic implementation until we have enough points
        if (effrule == erule::localp     and point <= 8) return diffPWCubic<effrule>(point, x);
        if (effrule == erule::semilocalp and point <= 4) return diffPWCubic<effrule>(point, x);
        if (effrule == erule::localpb    and point <= 4) return diffPWCubic<effrule>(point, x);
        if (effrule == erule::localp0    and point <= 2) return diffPWCubic<effrule>(point, x);
        int level = getLevel<effrule>(point);
        int max_ancestors = [&]()->int {
            switch(effrule) {
                case erule::pwc:        return 0;
                case erule::localp:     return level - 2;
                case erule::semilocalp:
                case erule::localpb:    return level - 1;
                default:                return level;
            };
        }();

        if (max_order > 0) max_ancestors = std::min(max_ancestors, max_order - 2);

        // This lambda captures most_turns and phantom_distance by reference, uses those as internal state variables, and on each
        // call it returns the next normalized ancestor node.
        int most_turns = 1;
        double phantom_distance = 1.0;
        auto update_and_get_next_node = [&]() {
            most_turns *= 2;
            phantom_distance = 2.0 * phantom_distance + 1.0;
            int turns = (effrule == erule::localp0) ? ((point+1) % most_turns) : ((point-1) % most_turns);
            return (turns < most_turns / 2) ?
                    (phantom_distance - 2.0 * ((double) turns)) :
                    (-phantom_distance + 2.0 * ((double) (most_turns - 1 - turns)));
        };

        // This lambda is the inverse transform of update_and_get_next_node() above, and returns the previous descendant node.
        auto rollback_and_get_prev_node = [&]() {
            most_turns /= 2;
            phantom_distance = 0.5 * (phantom_distance - 1.0);
            int turns = (effrule == erule::localp0) ? ((point+1) % most_turns) : ((point-1) % most_turns);
            return (turns < most_turns / 2) ?
                    (phantom_distance - 2.0 * ((double) turns)) :
                    (-phantom_distance + 2.0 * ((double) (most_turns - 1 - turns)));
        };

        // Does not include the additional factor (1-x) * (1+x) and the Lagrange coefficient.
        std::vector<double> left_prods(max_ancestors);
        left_prods[0] = 1.0;
        double node = update_and_get_next_node();
        double coeff = 1.0 / (-node);
        for(int j=1; j<max_ancestors; j++) {
            left_prods[j] = left_prods[j-1] * (x - node);
            node = update_and_get_next_node();
            coeff *= 1.0 / (-node);
        }
        double right_prod = 1.0;
        double derivative = left_prods[max_ancestors-1];
        for (int j=max_ancestors-2; j>=0; j--) {
            right_prod *= x - node;
            derivative += right_prod * left_prods[j];
            node = rollback_and_get_prev_node();
        }

        // Adjust for the additional factor (1-x) * (1+x) and the Lagrange coefficient.
        derivative = derivative * (1.0 - x) * (1.0 + x) + right_prod * (x - node) * (-2.0) * x;
        derivative *= coeff;

        return derivative;
    }